

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeySymToKeyMapping.cpp
# Opt level: O2

Key sf::priv::keySymToKey(KeySym symbol)

{
  Key KVar1;
  
  switch(symbol) {
  case 0x20:
    KVar1 = Space;
    break;
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x3a:
  case 0x3c:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5e:
  case 0x5f:
    goto switchD_001cda7d_caseD_ff8e;
  case 0x27:
    KVar1 = Apostrophe;
    break;
  case 0x2c:
    KVar1 = Comma;
    break;
  case 0x2d:
    KVar1 = Dash;
    break;
  case 0x2e:
switchD_001cda7d_caseD_ff9f:
    KVar1 = Period;
    break;
  case 0x2f:
    KVar1 = Slash;
    break;
  case 0x30:
    KVar1 = Num0;
    break;
  case 0x31:
    KVar1 = Num1;
    break;
  case 0x32:
    KVar1 = Num2;
    break;
  case 0x33:
    KVar1 = Num3;
    break;
  case 0x34:
    KVar1 = Num4;
    break;
  case 0x35:
    KVar1 = Num5;
    break;
  case 0x36:
    KVar1 = Num6;
    break;
  case 0x37:
    KVar1 = Num7;
    break;
  case 0x38:
    KVar1 = Num8;
    break;
  case 0x39:
    KVar1 = Num9;
    break;
  case 0x3b:
    KVar1 = SemiColon;
    break;
  case 0x3d:
    KVar1 = Equal;
    break;
  case 0x5b:
    KVar1 = LBracket;
    break;
  case 0x5c:
    KVar1 = BackSlash;
    break;
  case 0x5d:
    KVar1 = RBracket;
    break;
  case 0x60:
    KVar1 = Grave;
    break;
  case 0x61:
    return A;
  case 0x62:
    KVar1 = B;
    break;
  case 99:
    KVar1 = C;
    break;
  case 100:
    KVar1 = D;
    break;
  case 0x65:
    KVar1 = E;
    break;
  case 0x66:
    KVar1 = F;
    break;
  case 0x67:
    KVar1 = G;
    break;
  case 0x68:
    KVar1 = H;
    break;
  case 0x69:
    KVar1 = I;
    break;
  case 0x6a:
    KVar1 = J;
    break;
  case 0x6b:
    KVar1 = K;
    break;
  case 0x6c:
    KVar1 = L;
    break;
  case 0x6d:
    KVar1 = M;
    break;
  case 0x6e:
    KVar1 = N;
    break;
  case 0x6f:
    KVar1 = O;
    break;
  case 0x70:
    KVar1 = P;
    break;
  case 0x71:
    KVar1 = Q;
    break;
  case 0x72:
    KVar1 = R;
    break;
  case 0x73:
    KVar1 = S;
    break;
  case 0x74:
    KVar1 = T;
    break;
  case 0x75:
    KVar1 = U;
    break;
  case 0x76:
    KVar1 = V;
    break;
  case 0x77:
    KVar1 = W;
    break;
  case 0x78:
    KVar1 = X;
    break;
  case 0x79:
    KVar1 = Y;
    break;
  case 0x7a:
    KVar1 = Z;
    break;
  default:
    switch(symbol) {
    case 0xff8d:
switchD_001cda7d_caseD_ff8d:
      KVar1 = Enter;
      break;
    case 0xff8e:
    case 0xff8f:
    case 0xff90:
    case 0xff91:
    case 0xff92:
    case 0xff93:
    case 0xff94:
    case 0xffa0:
    case 0xffa1:
    case 0xffa2:
    case 0xffa3:
    case 0xffa4:
    case 0xffa5:
    case 0xffa6:
    case 0xffa7:
    case 0xffa8:
    case 0xffa9:
    case 0xffac:
    case 0xffae:
    case 0xffb0:
    case 0xffb1:
    case 0xffb2:
    case 0xffb3:
    case 0xffb4:
    case 0xffb5:
    case 0xffb6:
    case 0xffb7:
    case 0xffb8:
    case 0xffb9:
    case 0xffba:
    case 0xffbb:
    case 0xffbc:
    case 0xffbd:
    case 0xffcd:
    case 0xffce:
    case 0xffcf:
    case 0xffd0:
    case 0xffd1:
    case 0xffd2:
    case 0xffd3:
    case 0xffd4:
    case 0xffd5:
    case 0xffd6:
    case 0xffd7:
    case 0xffd8:
    case 0xffd9:
    case 0xffda:
    case 0xffdb:
    case 0xffdc:
    case 0xffdd:
    case 0xffde:
    case 0xffdf:
    case 0xffe0:
    case 0xffe5:
    case 0xffe6:
    case 0xffe7:
    case 0xffe8:
      goto switchD_001cda7d_caseD_ff8e;
    case 0xff95:
      KVar1 = Numpad7;
      break;
    case 0xff96:
      KVar1 = Numpad4;
      break;
    case 0xff97:
      KVar1 = Numpad8;
      break;
    case 0xff98:
      KVar1 = Numpad6;
      break;
    case 0xff99:
      KVar1 = Numpad2;
      break;
    case 0xff9a:
      KVar1 = Numpad9;
      break;
    case 0xff9b:
      KVar1 = Numpad3;
      break;
    case 0xff9c:
      KVar1 = Numpad1;
      break;
    case 0xff9d:
      KVar1 = Numpad5;
      break;
    case 0xff9e:
      KVar1 = Numpad0;
      break;
    case 0xff9f:
      goto switchD_001cda7d_caseD_ff9f;
    case 0xffaa:
      KVar1 = Multiply;
      break;
    case 0xffab:
      KVar1 = Add;
      break;
    case 0xffad:
      KVar1 = Subtract;
      break;
    case 0xffaf:
      KVar1 = Divide;
      break;
    case 0xffbe:
      KVar1 = F1;
      break;
    case 0xffbf:
      KVar1 = F2;
      break;
    case 0xffc0:
      KVar1 = F3;
      break;
    case 0xffc1:
      KVar1 = F4;
      break;
    case 0xffc2:
      KVar1 = F5;
      break;
    case 0xffc3:
      KVar1 = F6;
      break;
    case 0xffc4:
      KVar1 = F7;
      break;
    case 0xffc5:
      KVar1 = F8;
      break;
    case 0xffc6:
      KVar1 = F9;
      break;
    case 0xffc7:
      KVar1 = F10;
      break;
    case 0xffc8:
      KVar1 = F11;
      break;
    case 0xffc9:
      KVar1 = F12;
      break;
    case 0xffca:
      KVar1 = F13;
      break;
    case 0xffcb:
      KVar1 = F14;
      break;
    case 0xffcc:
      KVar1 = F15;
      break;
    case 0xffe1:
      KVar1 = LShift;
      break;
    case 0xffe2:
      KVar1 = RShift;
      break;
    case 0xffe3:
      KVar1 = LControl;
      break;
    case 0xffe4:
      KVar1 = RControl;
      break;
    case 0xffe9:
      KVar1 = LAlt;
      break;
    case 0xffea:
switchD_001cda7d_caseD_ffea:
      KVar1 = RAlt;
      break;
    case 0xffeb:
      KVar1 = LSystem;
      break;
    case 0xffec:
      KVar1 = RSystem;
      break;
    default:
      switch(symbol) {
      case 0xff50:
        KVar1 = Home;
        break;
      case 0xff51:
        KVar1 = Left;
        break;
      case 0xff52:
        KVar1 = Up;
        break;
      case 0xff53:
        KVar1 = Right;
        break;
      case 0xff54:
        KVar1 = Down;
        break;
      case 0xff55:
        KVar1 = PageUp;
        break;
      case 0xff56:
        KVar1 = PageDown;
        break;
      case 0xff57:
        KVar1 = End;
        break;
      case 0xff63:
        KVar1 = Insert;
        break;
      case 0xff67:
        KVar1 = Menu;
        break;
      default:
        if (symbol == 0xfe03) goto switchD_001cda7d_caseD_ffea;
        if (symbol == 0xff08) {
          return BackSpace;
        }
        if (symbol == 0xff09) {
          return Tab;
        }
        if (symbol == 0xff0d) goto switchD_001cda7d_caseD_ff8d;
        if (symbol == 0xff13) {
          return Pause;
        }
        if (symbol == 0xff1b) {
          return Escape;
        }
        if (symbol == 0xffff) {
          return Delete;
        }
      case 0xff58:
      case 0xff59:
      case 0xff5a:
      case 0xff5b:
      case 0xff5c:
      case 0xff5d:
      case 0xff5e:
      case 0xff5f:
      case 0xff60:
      case 0xff61:
      case 0xff62:
      case 0xff64:
      case 0xff65:
      case 0xff66:
switchD_001cda7d_caseD_ff8e:
        KVar1 = Unknown;
      }
    }
  }
  return KVar1;
}

Assistant:

Keyboard::Key keySymToKey(KeySym symbol)
{
    switch (symbol)
    {
        case XK_Shift_L:      return Keyboard::LShift;
        case XK_Shift_R:      return Keyboard::RShift;
        case XK_Control_L:    return Keyboard::LControl;
        case XK_Control_R:    return Keyboard::RControl;
        case XK_Alt_L:        return Keyboard::LAlt;
        case XK_ISO_Level3_Shift:
        case XK_Alt_R:        return Keyboard::RAlt;
        case XK_Super_L:      return Keyboard::LSystem;
        case XK_Super_R:      return Keyboard::RSystem;
        case XK_Menu:         return Keyboard::Menu;
        case XK_Escape:       return Keyboard::Escape;
        case XK_semicolon:    return Keyboard::SemiColon;
        case XK_slash:        return Keyboard::Slash;
        case XK_equal:        return Keyboard::Equal;
        case XK_minus:        return Keyboard::Dash;
        case XK_bracketleft:  return Keyboard::LBracket;
        case XK_bracketright: return Keyboard::RBracket;
        case XK_comma:        return Keyboard::Comma;
        case XK_period:       return Keyboard::Period;
        case XK_apostrophe:   return Keyboard::Quote;
        case XK_backslash:    return Keyboard::BackSlash;
        case XK_grave:        return Keyboard::Grave;
        case XK_space:        return Keyboard::Space;
        case XK_Return:       return Keyboard::Return;
        case XK_KP_Enter:     return Keyboard::Return;
        case XK_BackSpace:    return Keyboard::BackSpace;
        case XK_Tab:          return Keyboard::Tab;
        case XK_Prior:        return Keyboard::PageUp;
        case XK_Next:         return Keyboard::PageDown;
        case XK_End:          return Keyboard::End;
        case XK_Home:         return Keyboard::Home;
        case XK_Insert:       return Keyboard::Insert;
        case XK_Delete:       return Keyboard::Delete;
        case XK_KP_Add:       return Keyboard::Add;
        case XK_KP_Subtract:  return Keyboard::Subtract;
        case XK_KP_Multiply:  return Keyboard::Multiply;
        case XK_KP_Divide:    return Keyboard::Divide;
        case XK_KP_Delete:    return Keyboard::Period;
        case XK_Pause:        return Keyboard::Pause;
        case XK_F1:           return Keyboard::F1;
        case XK_F2:           return Keyboard::F2;
        case XK_F3:           return Keyboard::F3;
        case XK_F4:           return Keyboard::F4;
        case XK_F5:           return Keyboard::F5;
        case XK_F6:           return Keyboard::F6;
        case XK_F7:           return Keyboard::F7;
        case XK_F8:           return Keyboard::F8;
        case XK_F9:           return Keyboard::F9;
        case XK_F10:          return Keyboard::F10;
        case XK_F11:          return Keyboard::F11;
        case XK_F12:          return Keyboard::F12;
        case XK_F13:          return Keyboard::F13;
        case XK_F14:          return Keyboard::F14;
        case XK_F15:          return Keyboard::F15;
        case XK_Left:         return Keyboard::Left;
        case XK_Right:        return Keyboard::Right;
        case XK_Up:           return Keyboard::Up;
        case XK_Down:         return Keyboard::Down;
        case XK_KP_Insert:    return Keyboard::Numpad0;
        case XK_KP_End:       return Keyboard::Numpad1;
        case XK_KP_Down:      return Keyboard::Numpad2;
        case XK_KP_Page_Down: return Keyboard::Numpad3;
        case XK_KP_Left:      return Keyboard::Numpad4;
        case XK_KP_Begin:     return Keyboard::Numpad5;
        case XK_KP_Right:     return Keyboard::Numpad6;
        case XK_KP_Home:      return Keyboard::Numpad7;
        case XK_KP_Up:        return Keyboard::Numpad8;
        case XK_KP_Page_Up:   return Keyboard::Numpad9;
        case XK_a:            return Keyboard::A;
        case XK_b:            return Keyboard::B;
        case XK_c:            return Keyboard::C;
        case XK_d:            return Keyboard::D;
        case XK_e:            return Keyboard::E;
        case XK_f:            return Keyboard::F;
        case XK_g:            return Keyboard::G;
        case XK_h:            return Keyboard::H;
        case XK_i:            return Keyboard::I;
        case XK_j:            return Keyboard::J;
        case XK_k:            return Keyboard::K;
        case XK_l:            return Keyboard::L;
        case XK_m:            return Keyboard::M;
        case XK_n:            return Keyboard::N;
        case XK_o:            return Keyboard::O;
        case XK_p:            return Keyboard::P;
        case XK_q:            return Keyboard::Q;
        case XK_r:            return Keyboard::R;
        case XK_s:            return Keyboard::S;
        case XK_t:            return Keyboard::T;
        case XK_u:            return Keyboard::U;
        case XK_v:            return Keyboard::V;
        case XK_w:            return Keyboard::W;
        case XK_x:            return Keyboard::X;
        case XK_y:            return Keyboard::Y;
        case XK_z:            return Keyboard::Z;
        case XK_0:            return Keyboard::Num0;
        case XK_1:            return Keyboard::Num1;
        case XK_2:            return Keyboard::Num2;
        case XK_3:            return Keyboard::Num3;
        case XK_4:            return Keyboard::Num4;
        case XK_5:            return Keyboard::Num5;
        case XK_6:            return Keyboard::Num6;
        case XK_7:            return Keyboard::Num7;
        case XK_8:            return Keyboard::Num8;
        case XK_9:            return Keyboard::Num9;
        default:              return Keyboard::Unknown;
    }
}